

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O3

bool DiffDistTest2<unsigned_long,Blob<256>>(pfHash hash,bool drawDiagram)

{
  pointer pBVar1;
  uint8_t *puVar2;
  bool bVar3;
  int keybit;
  uint bit;
  bool bVar4;
  long lVar5;
  unsigned_long k;
  Blob<256> h2;
  Blob<256> h1;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_b0;
  Rand local_98;
  undefined1 local_80 [8];
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_98.x = 0x407129e7;
  local_98.y = 0x7888093c;
  local_98.z = 0x760425e2;
  local_98.w = 0x898677b9;
  local_b0.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(0x4000000);
  pBVar1 = local_b0.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
           super__Vector_impl_data._M_start + 0x200000;
  local_b0.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pBVar1;
  memset(local_b0.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
         super__Vector_impl_data._M_start,0,0x4000000);
  bVar4 = true;
  bit = 0;
  local_58 = 0;
  uStack_50 = 0;
  uStack_48 = 0;
  uStack_40 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  local_b0.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_finish = pBVar1;
  do {
    printf("Testing bit %d\n",(ulong)bit);
    lVar5 = 0;
    do {
      Rand::rand_p(&local_98,local_80,8);
      (*hash)(local_80,8,0,&local_58);
      flipbit(local_80,8,bit);
      (*hash)(local_80,8,0,&local_78);
      puVar2 = (local_b0.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                super__Vector_impl_data._M_start)->bytes + lVar5;
      *(uint *)puVar2 = (uint)local_78 ^ (uint)local_58;
      *(uint *)(puVar2 + 4) = local_78._4_4_ ^ local_58._4_4_;
      *(uint *)(puVar2 + 8) = (uint)uStack_70 ^ (uint)uStack_50;
      *(uint *)(puVar2 + 0xc) = uStack_70._4_4_ ^ uStack_50._4_4_;
      *(uint *)(puVar2 + 0x10) = (uint)uStack_68 ^ (uint)uStack_48;
      *(uint *)(puVar2 + 0x14) = uStack_68._4_4_ ^ uStack_48._4_4_;
      *(uint *)(puVar2 + 0x18) = (uint)uStack_60 ^ (uint)uStack_40;
      *(uint *)(puVar2 + 0x1c) = uStack_60._4_4_ ^ uStack_40._4_4_;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0x4000000);
    bVar3 = TestHashList<Blob<256>>(&local_b0,true,true,drawDiagram,true,true);
    bVar4 = (bool)(bVar4 & bVar3);
    putchar(10);
    bit = bit + 1;
  } while (bit != 0x40);
  if (local_b0.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar4;
}

Assistant:

bool DiffDistTest2 ( pfHash hash, bool drawDiagram )
{
  Rand r(857374);

  int keybits = sizeof(keytype) * 8;
  const int keycount = 256*256*32;
  keytype k;
  
  std::vector<hashtype> hashes(keycount);
  hashtype h1,h2;

  bool result = true;

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    printf("Testing bit %d\n",keybit);

    for(int i = 0; i < keycount; i++)
    {
      r.rand_p(&k,sizeof(keytype));
      
      hash(&k,sizeof(keytype),0,&h1);
      flipbit(&k,sizeof(keytype),keybit);
      hash(&k,sizeof(keytype),0,&h2);

      hashes[i] = h1 ^ h2;
    }

    result &= TestHashList<hashtype>(hashes,true,true,drawDiagram);
    printf("\n");
  }

  return result;
}